

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init_if_sw.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  longlong y [2];
  int x;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"\nBasic Example of if initializer.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Basic Example of switch-case initializer.\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main() {

	//if(init; cond)
	if (int x =9; x<9.000000001) 
		std::cout << "\nBasic Example of if initializer." << std::endl;
	//switch(init; cond)
	switch (long long y [] = {2198376, 7636847}; y[0] +1) {
		case 7637847:
			break;
		case 2198377:
			std::cout << "Basic Example of switch-case initializer.\n" << std::endl;
			break;
	}
	return 0;
}